

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_unique.h
# Opt level: O3

unique_ptr<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>_> __thiscall
spvtools::
MakeUnique<spvtools::opt::IRContext,spv_target_env&,std::function<void(spv_message_level_t,char_const*,spv_position_t_const&,char_const*)>&>
          (spvtools *this,spv_target_env *args,
          function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
          *args_1)

{
  spv_target_env env;
  _Manager_type p_Var1;
  IRContext *this_00;
  _Any_data local_48;
  _Manager_type local_38;
  _Invoker_type p_Stack_30;
  
  this_00 = (IRContext *)operator_new(0x250);
  env = *args;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_38 = (_Manager_type)0x0;
  p_Stack_30 = (_Invoker_type)0x0;
  p_Var1 = (args_1->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)(&local_48,(_Any_data *)args_1,__clone_functor);
    local_38 = (args_1->super__Function_base)._M_manager;
    p_Stack_30 = args_1->_M_invoker;
  }
  opt::IRContext::IRContext(this_00,env,(MessageConsumer *)&local_48);
  *(IRContext **)this = this_00;
  if (local_38 != (_Manager_type)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  return (__uniq_ptr_data<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}